

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::StructuredAssignmentPatternSyntax::setChild
          (StructuredAssignmentPatternSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxNode *this_00;
  SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *pSVar2;
  logic_error *this_01;
  Token TVar3;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index == 2) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->closeBrace).kind = TVar3.kind;
    (this->closeBrace).field_0x2 = TVar3._2_1_;
    (this->closeBrace).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->closeBrace).rawLen = TVar3.rawLen;
    (this->closeBrace).info = TVar3.info;
  }
  else if (index == 1) {
    this_00 = TokenOrSyntax::node(&child);
    pSVar2 = SyntaxNode::
             as<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>>
                       (this_00);
    (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar2->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar2->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->items).super_SyntaxListBase.childCount = (pSVar2->super_SyntaxListBase).childCount;
    sVar1 = (pSVar2->elements).size_;
    (this->items).elements.data_ = (pSVar2->elements).data_;
    (this->items).elements.size_ = sVar1;
  }
  else {
    if (index != 0) {
      this_01 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
                 ,&local_d9);
      std::operator+(&local_98,&local_b8,":");
      std::__cxx11::to_string(&local_d8,0x30da);
      std::operator+(&local_78,&local_98,&local_d8);
      std::operator+(&local_58,&local_78,": ");
      std::operator+(&local_38,&local_58,"Default case should be unreachable!");
      std::logic_error::logic_error(this_01,(string *)&local_38);
      __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->openBrace).kind = TVar3.kind;
    (this->openBrace).field_0x2 = TVar3._2_1_;
    (this->openBrace).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->openBrace).rawLen = TVar3.rawLen;
    (this->openBrace).info = TVar3.info;
  }
  return;
}

Assistant:

void StructuredAssignmentPatternSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openBrace = child.token(); return;
        case 1: items = child.node()->as<SeparatedSyntaxList<AssignmentPatternItemSyntax>>(); return;
        case 2: closeBrace = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}